

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Tracks::AddTrack(Tracks *this,Track *track,int32_t number)

{
  Track **ppTVar1;
  Track **ppTVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (number < 0) {
    return false;
  }
  if (0x7e < (uint)number) {
    return false;
  }
  if (this->wrote_tracks_ != false) {
    return false;
  }
  uVar5 = (ulong)this->track_entries_size_;
  if (number != 0) {
    if (this->track_entries_size_ == 0) {
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (this->track_entries_[uVar4]->number_ == (ulong)(uint)number) {
          return false;
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  uVar6 = (int)uVar5 + 1;
  ppTVar2 = (Track **)operator_new__((ulong)uVar6 * 8,(nothrow_t *)&std::nothrow);
  if (ppTVar2 == (Track **)0x0) {
    return false;
  }
  ppTVar1 = this->track_entries_;
  if ((int)uVar5 == 0) {
    if (ppTVar1 == (Track **)0x0) {
      uVar3 = 0;
      goto LAB_0014d378;
    }
  }
  else {
    uVar4 = 0;
    do {
      ppTVar2[uVar4] = ppTVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  operator_delete__(ppTVar1);
  uVar3 = this->track_entries_size_;
LAB_0014d378:
  if ((number == 0) && (number = uVar6, uVar3 != 0)) {
    do {
      uVar5 = 0;
      while (ppTVar2[uVar5]->number_ != (ulong)(uint)number) {
        uVar5 = uVar5 + 1;
        if (uVar3 == uVar5) goto LAB_0014d37e;
      }
      number = number + 1;
    } while( true );
  }
LAB_0014d37e:
  track->number_ = (ulong)(uint)number;
  this->track_entries_ = ppTVar2;
  ppTVar2[uVar3] = track;
  this->track_entries_size_ = uVar6;
  return true;
}

Assistant:

bool Tracks::AddTrack(Track* track, int32_t number) {
  if (number < 0 || wrote_tracks_)
    return false;

  // This muxer only supports track numbers in the range [1, 126], in
  // order to be able (to use Matroska integer representation) to
  // serialize the block header (of which the track number is a part)
  // for a frame using exactly 4 bytes.

  if (number > 0x7E)
    return false;

  uint32_t track_num = number;

  if (track_num > 0) {
    // Check to make sure a track does not already have |track_num|.
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      if (track_entries_[i]->number() == track_num)
        return false;
    }
  }

  const uint32_t count = track_entries_size_ + 1;

  Track** const track_entries = new (std::nothrow) Track*[count];  // NOLINT
  if (!track_entries)
    return false;

  for (uint32_t i = 0; i < track_entries_size_; ++i) {
    track_entries[i] = track_entries_[i];
  }

  delete[] track_entries_;

  // Find the lowest availible track number > 0.
  if (track_num == 0) {
    track_num = count;

    // Check to make sure a track does not already have |track_num|.
    bool exit = false;
    do {
      exit = true;
      for (uint32_t i = 0; i < track_entries_size_; ++i) {
        if (track_entries[i]->number() == track_num) {
          track_num++;
          exit = false;
          break;
        }
      }
    } while (!exit);
  }
  track->set_number(track_num);

  track_entries_ = track_entries;
  track_entries_[track_entries_size_] = track;
  track_entries_size_ = count;
  return true;
}